

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Situations * __thiscall
parser::Parser::goTo
          (Situations *__return_storage_ptr__,Parser *this,Grammar *grammar,Situations *situations,
          GrammaticSymbol *grammaticSymbol)

{
  bool bVar1;
  pointer pSVar2;
  size_type sVar3;
  pointer pSVar4;
  const_reference lhs;
  reference __x;
  pointer pSVar5;
  reference situation;
  iterator __first;
  iterator __last;
  iterator __i;
  insert_iterator<std::vector<parser::Situation,_std::allocator<parser::Situation>_>_> __result;
  __normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_80;
  __normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_78;
  iterator goToSit;
  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_58;
  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_50;
  const_iterator s;
  Situations goToSituations;
  GrammaticSymbol *grammaticSymbol_local;
  Situations *situations_local;
  Grammar *grammar_local;
  Parser *this_local;
  Situations *goToClosure;
  
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::vector
            ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s);
  local_50._M_current =
       (Situation *)
       std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin(situations);
  while( true ) {
    local_58._M_current =
         (Situation *)
         std::vector<parser::Situation,_std::allocator<parser::Situation>_>::end(situations);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
             ::operator->(&local_50);
    sVar3 = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::size
                      (&(pSVar2->super_Convolution).body);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
             ::operator->(&local_50);
    if (sVar3 != pSVar2->point) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
               ::operator->(&local_50);
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
               ::operator->(&local_50);
      lhs = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::at
                      (&(pSVar2->super_Convolution).body,pSVar4->point);
      bVar1 = parser::operator==(lhs,grammaticSymbol);
      if (bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
              ::operator*(&local_50);
        std::vector<parser::Situation,_std::allocator<parser::Situation>_>::push_back
                  ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s,__x);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
    ::operator++(&local_50);
  }
  bVar1 = std::vector<parser::Situation,_std::allocator<parser::Situation>_>::empty
                    ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<parser::Situation,_std::allocator<parser::Situation>_>::vector
              (__return_storage_ptr__);
  }
  else {
    goToSit._M_current._7_1_ = 0;
    std::vector<parser::Situation,_std::allocator<parser::Situation>_>::vector
              (__return_storage_ptr__);
    local_78._M_current =
         (Situation *)
         std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin
                   ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s);
    while( true ) {
      local_80._M_current =
           (Situation *)
           std::vector<parser::Situation,_std::allocator<parser::Situation>_>::end
                     ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s);
      bVar1 = __gnu_cxx::operator!=(&local_78,&local_80);
      if (!bVar1) break;
      pSVar5 = __gnu_cxx::
               __normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
               ::operator->(&local_78);
      pSVar5->point = pSVar5->point + 1;
      situation = __gnu_cxx::
                  __normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                  ::operator*(&local_78);
      closure(__return_storage_ptr__,grammar,situation);
      __gnu_cxx::
      __normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
      ::operator++(&local_78);
    }
    __first = std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin
                        ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s);
    __last = std::vector<parser::Situation,_std::allocator<parser::Situation>_>::end
                       ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s);
    __i = std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin
                    (__return_storage_ptr__);
    __result = std::inserter<std::vector<parser::Situation,std::allocator<parser::Situation>>>
                         (__return_storage_ptr__,__i);
    std::
    copy<__gnu_cxx::__normal_iterator<parser::Situation*,std::vector<parser::Situation,std::allocator<parser::Situation>>>,std::insert_iterator<std::vector<parser::Situation,std::allocator<parser::Situation>>>>
              ((__normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                )__first._M_current,
               (__normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                )__last._M_current,__result);
    goToSit._M_current._7_1_ = 1;
  }
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
            ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&s);
  return __return_storage_ptr__;
}

Assistant:

Situations goTo(Grammar const& grammar,
                        Situations const& situations,
                        GrammaticSymbol const& grammaticSymbol) {
            Situations goToSituations;
            for_each_c(Situations, situations, s) {
                if (s->body.size() == s->point)
                    continue;
                if (s->body.at(s->point) == grammaticSymbol) {
                    goToSituations.push_back(*s);
                }
            }
            if (goToSituations.empty()) {
                return Situations();
            }
            Situations goToClosure;
            for_each(Situations, goToSituations, goToSit) {
                goToSit->point++;
                closure(goToClosure, grammar, *goToSit);
            }
            std::copy(goToSituations.begin(), goToSituations.end(), std::inserter(goToClosure, goToClosure.begin()));
            return goToClosure;
        }